

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

void __thiscall Process::Process(Process *this)

{
  this->fdStdOutRead = 0;
  this->fdStdErrRead = 0;
  this->fdStdInWrite = 0;
  this->pid = 0;
  return;
}

Assistant:

Process::Process() : pid(0)
{
#ifdef _WIN32
  ASSERT(sizeof(hProcess) >= sizeof(HANDLE));
  hProcess = INVALID_HANDLE_VALUE;
  hStdOutRead = INVALID_HANDLE_VALUE;
  hStdErrRead = INVALID_HANDLE_VALUE;
  hStdInWrite = INVALID_HANDLE_VALUE;
#else
  fdStdOutRead = 0;
  fdStdErrRead = 0;
  fdStdInWrite = 0;
#endif
}